

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void setup_doors(tgestate_t *state)

{
  room_t rVar1;
  doorindex_t *pdVar2;
  uint8_t door_iters;
  door_t *door;
  doorindex_t door_index;
  uint8_t room;
  uint8_t iters;
  doorindex_t *pdoorindex;
  tgestate_t *state_local;
  
  iters = '\x04';
  pdVar2 = state->interior_doors + 3;
  do {
    pdoorindex = pdVar2;
    *pdoorindex = 0xff;
    iters = iters + 0xff;
    pdVar2 = pdoorindex + -1;
  } while (iters != '\0');
  rVar1 = state->room_index;
  door_index = '\0';
  door = doors;
  door_iters = '|';
  do {
    if ((byte)(door->room_and_direction & 0xfc) == (byte)(rVar1 << 2)) {
      *pdoorindex = door_index ^ 0x80;
      pdoorindex = pdoorindex + 1;
    }
    door_index = door_index ^ 0x80;
    if (door_index < 0x80) {
      door_index = door_index + 1;
    }
    door = door + 1;
    door_iters = door_iters + 0xff;
  } while (door_iters != '\0');
  return;
}

Assistant:

void setup_doors(tgestate_t *state)
{
  doorindex_t  *pdoorindex; /* was DE */
  uint8_t       iters;      /* was B */
  uint8_t       room;       /* was B */ // same type as door_t->room_and_flags
  doorindex_t   door_index; /* was C */
  const door_t *door;       /* was HL' */
  uint8_t       door_iters; /* was B' */

  assert(state != NULL);

  /* Wipe state->interior_doors[] with interiordoor_NONE.
   * Alternative: memset(&state->interior_doors[0], interiordoor_NONE, 4); */
  pdoorindex = &state->interior_doors[3];
  iters = 4;
  do
    *pdoorindex-- = interiordoor_NONE;
  while (--iters);

  pdoorindex++; /* Reset to first byte of interior_doors[]. */
  ASSERT_DOORS_VALID(pdoorindex);

  /* Ensure that no flag bits remain. */
  assert(state->room_index < room__LIMIT);

  room       = state->room_index << 2; /* Shift left to match comparison in loop. */
  door_index = 0;
  door       = &doors[0];
  door_iters = NELEMS(doors); /* Iterate over every door in doors[]. */
  do
  {
    /* Save the door index (and current reverse flag) whenever we match the
     * current room. Rooms are always rectangular so should have no more than
     * four doors present but that is unchecked by this code. */
    if ((door->room_and_direction & ~door_FLAGS_MASK_DIRECTION) == room)
      *pdoorindex++ = door_index ^ door_REVERSE;

    /* On every iteration toggle the reverse flag. */
    door_index ^= door_REVERSE;

    /* Increment door_index once every two iterations. */
    if (door_index < door_REVERSE) /* Conv: was JP M. */
      door_index++;

    door++;
  }
  while (--door_iters);
}